

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O0

void handle_resize(void)

{
  int local_1c;
  gamewin *local_10;
  gamewin *gw;
  
  for (local_10 = firstgw; local_10 != (gamewin *)0x0; local_10 = local_10->next) {
    if (local_10->resize != (_func_void_gamewin_ptr *)0x0) {
      (*local_10->resize)(local_10);
      if (local_10->win == (WINDOW_conflict *)0x0) {
        local_1c = -1;
      }
      else {
        local_1c = local_10->win->_maxy + 1;
      }
      wredrawln(local_10->win,0,local_1c);
      wnoutrefresh(local_10->win);
    }
  }
  rebuild_ui();
  doupdate();
  return;
}

Assistant:

void handle_resize(void)
{
    struct gamewin *gw;

    for (gw = firstgw; gw; gw = gw->next) {
	if (!gw->resize)
	    continue;

	gw->resize(gw);
	redrawwin(gw->win);
	wnoutrefresh(gw->win);
    }

    rebuild_ui();
    doupdate();
}